

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void google::protobuf::internal::WireFormatLite::WriteFixed32Array
               (uint32_t *a,int n,CodedOutputStream *output)

{
  io::CodedOutputStream::WriteRaw(output,a,n * 4);
  return;
}

Assistant:

void WireFormatLite::WriteFixed32Array(const uint32_t* a, int n,
                                       io::CodedOutputStream* output) {
  WriteArray<uint32_t>(a, n, output);
}